

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

CubicSplinePtr __thiscall OpenMD::EAMAdapter::getRhoSpline(EAMAdapter *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  CubicSplinePtr CVar1;
  int i;
  vector<double,_std::allocator<double>_> rvals;
  RealType dr;
  int nr;
  FuncflParameters funcflParam;
  CubicSplinePtr *cs;
  element_type *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  int iVar2;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  CubicSpline *in_stack_ffffffffffffff50;
  undefined4 local_70;
  EAMAdapter *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  getFuncflParam(in_stack_ffffffffffffffe8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x293216);
  for (iVar2 = 0; iVar2 < local_70; iVar2 = iVar2 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)this_00,(value_type_conflict2 *)in_RDI);
  }
  std::make_shared<OpenMD::CubicSpline>();
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29328a);
  CubicSpline::addPoints
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (vector<double,_std::allocator<double>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff40));
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  FuncflParameters::~FuncflParameters((FuncflParameters *)this_00);
  CVar1.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (CubicSplinePtr)CVar1.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CubicSplinePtr EAMAdapter::getRhoSpline() {
    FuncflParameters funcflParam = getFuncflParam();
    int nr                       = funcflParam.nr;
    RealType dr                  = funcflParam.dr;
    std::vector<RealType> rvals;

    for (int i = 0; i < nr; i++)
      rvals.push_back(RealType(i) * dr);

    CubicSplinePtr cs {std::make_shared<CubicSpline>()};
    cs->addPoints(rvals, funcflParam.rho);
    return cs;
  }